

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

size_t mpz_out_str(FILE *stream,int base,__mpz_struct *x)

{
  char *__s;
  size_t __n;
  FILE *in_RDI;
  size_t n;
  size_t len;
  char *str;
  int in_stack_00000034;
  char *in_stack_00000038;
  size_t local_8;
  
  __s = mpz_get_str(in_stack_00000038,in_stack_00000034,(__mpz_struct *)stream);
  if (__s == (char *)0x0) {
    local_8 = 0;
  }
  else {
    __n = strlen(__s);
    local_8 = fwrite(__s,1,__n,in_RDI);
    (*gmp_free_func)(__s,__n + 1);
  }
  return local_8;
}

Assistant:

size_t
mpz_out_str (FILE *stream, int base, const mpz_t x)
{
  char *str;
  size_t len, n;

  str = mpz_get_str (NULL, base, x);
  if (!str)
    return 0;
  len = strlen (str);
  n = fwrite (str, 1, len, stream);
  gmp_free (str, len + 1);
  return n;
}